

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sudoku.cpp
# Opt level: O1

void __thiscall Sudoku::Sudoku(Sudoku *this,string *soubor)

{
  sudoku_policko *psVar1;
  int iVar2;
  ostream *poVar3;
  istream *piVar4;
  long lVar5;
  uint uVar6;
  char *pcVar7;
  uint uVar8;
  char znak;
  ifstream souborKeCteni;
  byte local_231;
  long local_230 [4];
  byte abStack_210 [488];
  
  memset(this,0,0x1bc);
  std::ifstream::ifstream(local_230);
  std::ifstream::open((char *)local_230,(_Ios_Openmode)(soubor->_M_dataplus)._M_p);
  if ((abStack_210[*(long *)(local_230[0] + -0x18)] & 5) == 0) {
    uVar6 = 0;
    while( true ) {
      piVar4 = std::operator>>((istream *)local_230,(char *)&local_231);
      if ((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) || (0x50 < uVar6))
      break;
      if ((byte)(local_231 - 0x31) < 9) {
        iVar2 = doplnK(this,uVar6 % 9,uVar6 / 9,local_231 - 0x30);
        if (iVar2 == 0) {
          std::ifstream::close();
          lVar5 = 0x23;
          pcVar7 = "Soubor neodpovida pravidlum sudoku.";
          goto LAB_0010324f;
        }
        psVar1 = (this->s).pole + uVar6;
        *(byte *)psVar1 = *(byte *)psVar1 | 0x10;
        uVar8 = 1;
      }
      else {
        uVar8 = (uint)((local_231 & 0xfd) == 0x2c);
      }
      uVar6 = uVar6 + uVar8;
    }
    uVar8 = 2;
    if (uVar6 != 0x51) {
      std::ifstream::close();
      lVar5 = 0x1e;
      pcVar7 = "Soubor neobsahuje cele sudoku.";
LAB_0010324f:
      (this->s).stav = 1;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar7,lVar5);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '0');
      std::ostream::put('0');
      std::ostream::flush();
      goto LAB_00103293;
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Soubor ",7);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(soubor->_M_dataplus)._M_p,soubor->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," nelze precist.",0xf);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    uVar8 = 1;
    std::ostream::flush();
  }
  (this->s).stav = uVar8;
LAB_00103293:
  std::ifstream::~ifstream(local_230);
  return;
}

Assistant:

Sudoku::Sudoku(string soubor)
{
  char znak;
  int index = 0;
  initPole();// vynulujeme pole
  // otevreme soubor pro cteni
  ifstream souborKeCteni;
  souborKeCteni.open(soubor.c_str());

  if (!souborKeCteni) // nepodarilo se?
  {
    cerr << "Soubor " << soubor << " nelze precist." << endl;
    s.stav= _chyba; // nastavime chybovy stav a vratime se
    return;
  }
  while ((souborKeCteni >> znak) && (index < 81)) // cteni ze souboru po znacich dokud nemame cele sudoku prectene
  {
    if(znak >= '1' && znak <= '9')// je to cislo?
    {
      if (doplnK(index %9, index/9, znak - '1' + 1)) // zkusime ho doplnit do sudoku
      {
        s.pole[index].pevne = 1; // vsechna policka nactena za souboru jsou pevna
        index++;
        continue;// kdyz se povede, pokracujeme dalsim znakem
      }
      // pokud se nepodari doplnit, propadne to sem, dojde k chybe
      souborKeCteni.close();
      s.stav= _chyba;
      cerr << "Soubor neodpovida pravidlum sudoku." << endl;
      return;
    }
    else if(znak == '.' || znak == ',')// je to tecka nebo carka?
    {
      index++;// prazdne policko -> posuneme se o policko dal
    }
    // jinak se nic nedeje.
  }
  if(index != 81)// pokud jsme nedosli na konec sudoku, znamena to, ze ho kus chybi
  {
    // uklidime a nastavime chybovy stav
    souborKeCteni.close();
    s.stav= _chyba;
    cerr << "Soubor neobsahuje cele sudoku." << endl;
    return;
  }
  s.stav = _nastavene; // vse OK
}